

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseBlock(WastParser *this,Block *block)

{
  Result RVar1;
  Enum EVar2;
  Token local_60;
  
  RVar1 = ParseBlockDeclaration(this,&block->decl);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = ParseInstrList(this,&block->exprs);
    if (RVar1.enum_ != Error) {
      GetToken(&local_60,this);
      (block->end_loc).field_1.field_1.offset = (size_t)local_60.loc.field_1.field_1.offset;
      *(undefined8 *)((long)&(block->end_loc).field_1 + 8) = local_60.loc.field_1._8_8_;
      (block->end_loc).filename.data_ = local_60.loc.filename.data_;
      (block->end_loc).filename.size_ = local_60.loc.filename.size_;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result WastParser::ParseBlock(Block* block) {
  WABT_TRACE(ParseBlock);
  CHECK_RESULT(ParseBlockDeclaration(&block->decl));
  CHECK_RESULT(ParseInstrList(&block->exprs));
  block->end_loc = GetLocation();
  return Result::Ok;
}